

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O2

shared_ptr<BER_CONTAINER> __thiscall
ComplexType::createObjectForType(ComplexType *this,ASN_TYPE valueType)

{
  ulong uVar1;
  IntegerType *__p;
  ComplexType *__p_00;
  NetworkAddress *__p_01;
  ImplicitNullType *__p_02;
  Gauge *__p_03;
  Counter64 *__p_04;
  Counter32 *__p_05;
  OpaqueType *__p_06;
  TimestampType *__p_07;
  NullType *__p_08;
  OctetType *__p_09;
  OIDType *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  shared_ptr<BER_CONTAINER> sVar2;
  
  uVar1 = (ulong)(valueType - NOSUCHINSTANCE);
  if (valueType - NOSUCHINSTANCE < 0x27) {
    if ((0x7780000000U >> (uVar1 & 0x3f) & 1) == 0) {
      if (uVar1 == 0) {
        __p_02 = (ImplicitNullType *)operator_new(0x10);
        (__p_02->super_NullType).super_BER_CONTAINER._vptr_BER_CONTAINER =
             (_func_int **)&PTR__BER_CONTAINER_0019b0d8;
        (__p_02->super_NullType).super_BER_CONTAINER._type = NOSUCHINSTANCE;
        (__p_02->super_NullType).super_BER_CONTAINER._length = 0;
      }
      else {
        if (uVar1 != 1) goto LAB_001579dc;
        __p_02 = (ImplicitNullType *)operator_new(0x10);
        (__p_02->super_NullType).super_BER_CONTAINER._vptr_BER_CONTAINER =
             (_func_int **)&PTR__BER_CONTAINER_0019b0d8;
        (__p_02->super_NullType).super_BER_CONTAINER._type = ENDOFMIBVIEW;
        (__p_02->super_NullType).super_BER_CONTAINER._length = 0;
      }
LAB_00157c35:
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<ImplicitNullType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_02);
      in_RDX._M_pi = extraout_RDX_10;
      goto LAB_00157c40;
    }
LAB_001579a6:
    __p_00 = (ComplexType *)operator_new(0x28);
    (__p_00->super_BER_CONTAINER)._type = valueType;
    (__p_00->super_BER_CONTAINER)._length = 0;
    (__p_00->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__ComplexType_0019b088;
    (__p_00->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p_00->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p_00->values).
    super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ComplexType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_00);
    in_RDX._M_pi = extraout_RDX_00;
    goto LAB_00157c40;
  }
LAB_001579dc:
  switch(valueType) {
  case NETWORK_ADDRESS:
    __p_01 = (NetworkAddress *)operator_new(0x20);
    (__p_01->super_BER_CONTAINER)._type = NETWORK_ADDRESS;
    (__p_01->super_BER_CONTAINER)._length = 0;
    (__p_01->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__NetworkAddress_0019b5d0;
    (__p_01->_value)._vptr_IPAddress = (_func_int **)&PTR__IPAddress_00196b50;
    (__p_01->_value)._address = INADDR_NONE._address;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NetworkAddress,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_01);
    in_RDX._M_pi = extraout_RDX_01;
    break;
  case COUNTER32:
    __p_05 = (Counter32 *)operator_new(0x18);
    (__p_05->super_IntegerType)._value = 0;
    (__p_05->super_IntegerType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR__BER_CONTAINER_0019b128;
    (__p_05->super_IntegerType).super_BER_CONTAINER._type = COUNTER32;
    (__p_05->super_IntegerType).super_BER_CONTAINER._length = 0;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Counter32,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_05);
    in_RDX._M_pi = extraout_RDX_04;
    break;
  case GAUGE32:
    __p_03 = (Gauge *)operator_new(0x18);
    (__p_03->super_IntegerType)._value = 0;
    (__p_03->super_IntegerType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR__BER_CONTAINER_0019b178;
    (__p_03->super_IntegerType).super_BER_CONTAINER._type = GAUGE32;
    (__p_03->super_IntegerType).super_BER_CONTAINER._length = 0;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Gauge,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_03);
    in_RDX._M_pi = extraout_RDX_02;
    break;
  case TIMESTAMP:
    __p_07 = (TimestampType *)operator_new(0x18);
    (__p_07->super_IntegerType)._value = 0;
    (__p_07->super_IntegerType).super_BER_CONTAINER._vptr_BER_CONTAINER =
         (_func_int **)&PTR__BER_CONTAINER_0019b000;
    (__p_07->super_IntegerType).super_BER_CONTAINER._type = TIMESTAMP;
    (__p_07->super_IntegerType).super_BER_CONTAINER._length = 0;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TimestampType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_07);
    in_RDX._M_pi = extraout_RDX_06;
    break;
  case OPAQUE:
    __p_06 = (OpaqueType *)operator_new(0x20);
    (__p_06->super_BER_CONTAINER)._type = OPAQUE;
    (__p_06->super_BER_CONTAINER)._length = 0;
    (__p_06->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OpaqueType_0019b6c0;
    __p_06->_value = (uint8_t *)0x0;
    __p_06->_dataLength = 0;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<OpaqueType,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_06);
    in_RDX._M_pi = extraout_RDX_05;
    break;
  case 0x45:
    goto switchD_0015795e_caseD_3;
  case COUNTER64:
    __p_04 = (Counter64 *)operator_new(0x18);
    (__p_04->super_BER_CONTAINER)._type = COUNTER64;
    (__p_04->super_BER_CONTAINER)._length = 0;
    (__p_04->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__BER_CONTAINER_0019b7b0;
    __p_04->_value = 0;
    std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Counter64,void>
              ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_04);
    in_RDX._M_pi = extraout_RDX_03;
    break;
  default:
    switch(valueType) {
    case INTEGER:
      __p = (IntegerType *)operator_new(0x18);
      (__p->super_BER_CONTAINER)._type = INTEGER;
      (__p->super_BER_CONTAINER)._length = 0;
      (__p->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__BER_CONTAINER_0019b620;
      __p->_value = 0;
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<IntegerType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p);
      in_RDX._M_pi = extraout_RDX;
      break;
    case STRING:
      __p_09 = (OctetType *)operator_new(0x30);
      (__p_09->super_BER_CONTAINER)._type = STRING;
      (__p_09->super_BER_CONTAINER)._length = 0;
      (__p_09->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OctetType_0019b670;
      (__p_09->_value)._M_dataplus._M_p = (pointer)&(__p_09->_value).field_2;
      (__p_09->_value)._M_string_length = 0;
      (__p_09->_value).field_2._M_local_buf[0] = '\0';
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<OctetType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_09);
      in_RDX._M_pi = extraout_RDX_08;
      break;
    case NULLTYPE:
      __p_08 = (NullType *)operator_new(0x10);
      (__p_08->super_BER_CONTAINER)._type = NULLTYPE;
      (__p_08->super_BER_CONTAINER)._length = 0;
      (__p_08->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__BER_CONTAINER_0019b760
      ;
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NullType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,__p_08);
      in_RDX._M_pi = extraout_RDX_07;
      break;
    case OID:
      this_00 = (OIDType *)operator_new(0x50);
      OIDType::OIDType(this_00);
      std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<OIDType,void>
                ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
      in_RDX._M_pi = extraout_RDX_09;
      break;
    default:
      if (valueType == STRUCTURE) goto LAB_001579a6;
      if (valueType == NOSUCHOBJECT) {
        __p_02 = (ImplicitNullType *)operator_new(0x10);
        (__p_02->super_NullType).super_BER_CONTAINER._vptr_BER_CONTAINER =
             (_func_int **)&PTR__BER_CONTAINER_0019b0d8;
        (__p_02->super_NullType).super_BER_CONTAINER._type = NOSUCHOBJECT;
        (__p_02->super_NullType).super_BER_CONTAINER._length = 0;
        goto LAB_00157c35;
      }
    case 3:
switchD_0015795e_caseD_3:
      (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)0x0;
      (this->super_BER_CONTAINER)._type = 0;
      (this->super_BER_CONTAINER)._length = 0;
    }
  }
LAB_00157c40:
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_BER_CONTAINER;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> ComplexType::createObjectForType(ASN_TYPE valueType){
    SNMP_LOGD("Creating object of type: %d\n", valueType);
    switch(valueType){
        case INTEGER:
            return std::shared_ptr<BER_CONTAINER>(new IntegerType());
        case STRING:
            return std::shared_ptr<BER_CONTAINER>(new OctetType());
        case OID: 
            return std::shared_ptr<BER_CONTAINER>(new OIDType());
        case NULLTYPE:
            return std::shared_ptr<BER_CONTAINER>(new NullType());

        case NOSUCHOBJECT:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(NOSUCHOBJECT));
        case NOSUCHINSTANCE:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(NOSUCHINSTANCE));
        case ENDOFMIBVIEW:
            return std::shared_ptr<BER_CONTAINER>(new ImplicitNullType(ENDOFMIBVIEW));

        // devired
        case NETWORK_ADDRESS:
            return std::shared_ptr<BER_CONTAINER>(new NetworkAddress());
        case TIMESTAMP:
            return std::shared_ptr<BER_CONTAINER>(new TimestampType());
        case COUNTER32:
            return std::shared_ptr<BER_CONTAINER>(new Counter32());
        case GAUGE32:
            return std::shared_ptr<BER_CONTAINER>(new Gauge());
        case COUNTER64:
            return std::shared_ptr<BER_CONTAINER>(new Counter64());
        case OPAQUE:
            return std::shared_ptr<BER_CONTAINER>(new OpaqueType());

        // Complex
        /* OPAQUE = 0x44 */
        case STRUCTURE:

        case GetRequestPDU:
        case GetNextRequestPDU:
        case GetResponsePDU:
        case SetRequestPDU:
        case GetBulkRequestPDU:

        //case TrapPDU: // should never get v1trap, but put it in anyway
        case InformRequestPDU:
        case Trapv2PDU:
            return std::shared_ptr<BER_CONTAINER>(new ComplexType(valueType));
        default:
            return nullptr;
    }
}